

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::EmuEmuD3D0::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,EmuEmuD3D0 *this)

{
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdNotify *this_01;
  MthdPmTrigger *this_02;
  MthdDmaNotify *this_03;
  MthdDmaGrobj *this_04;
  MthdCtxClip *this_05;
  MthdCtxSurf *pMVar2;
  MthdMissing *this_06;
  MthdEmuD3D56TexOffset *this_07;
  MthdEmuEmuD3D0TexFormat *this_08;
  MthdEmuEmuD3D0TexFilter *this_09;
  MthdEmuD3D56FogColor *this_10;
  MthdEmuEmuD3D0Config *this_11;
  MthdEmuEmuD3D0Alpha *this_12;
  MthdEmuEmuD3D0TlvFogTri *this_13;
  MthdEmuD3D56TlvColor *this_14;
  MthdEmuD3D56TlvX *this_15;
  MthdEmuD3D56TlvY *this_16;
  MthdEmuD3D56TlvZ *this_17;
  MthdEmuD3D56TlvW *this_18;
  MthdEmuD3D56TlvUv *pMVar3;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_483;
  undefined1 local_482;
  allocator local_481;
  string local_480 [38];
  undefined1 local_45a;
  allocator local_459;
  string local_458 [38];
  undefined1 local_432;
  allocator local_431;
  string local_430 [38];
  undefined1 local_40a;
  allocator local_409;
  string local_408 [38];
  undefined1 local_3e2;
  allocator local_3e1;
  string local_3e0 [38];
  undefined1 local_3ba;
  allocator local_3b9;
  string local_3b8 [38];
  undefined1 local_392;
  allocator local_391;
  string local_390 [38];
  undefined1 local_36a;
  allocator local_369;
  string local_368 [38];
  undefined1 local_342;
  allocator local_341;
  string local_340 [38];
  undefined1 local_31a;
  allocator local_319;
  string local_318 [38];
  undefined1 local_2f2;
  allocator local_2f1;
  string local_2f0 [38];
  undefined1 local_2ca;
  allocator local_2c9;
  string local_2c8 [38];
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0 [38];
  undefined1 local_27a;
  allocator local_279;
  string local_278 [38];
  undefined1 local_252;
  allocator local_251;
  string local_250 [38];
  undefined1 local_22a;
  allocator local_229;
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [38];
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8 [38];
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [38];
  undefined1 local_18a;
  allocator local_189;
  string local_188 [38];
  undefined1 local_162;
  allocator local_161;
  string local_160 [38];
  undefined1 local_13a;
  allocator local_139;
  string local_138 [38];
  undefined1 local_112;
  allocator local_111;
  string local_110 [48];
  SingleMthdTest *local_e0;
  MthdNotify *local_d8;
  MthdPmTrigger *local_d0;
  MthdDmaNotify *local_c8;
  MthdDmaGrobj *local_c0;
  MthdCtxClip *local_b8;
  MthdCtxSurf *local_b0;
  MthdCtxSurf *local_a8;
  MthdMissing *local_a0;
  MthdEmuD3D56TexOffset *local_98;
  MthdEmuEmuD3D0TexFormat *local_90;
  MthdEmuEmuD3D0TexFilter *local_88;
  MthdEmuD3D56FogColor *local_80;
  MthdEmuEmuD3D0Config *local_78;
  MthdEmuEmuD3D0Alpha *local_70;
  MthdEmuEmuD3D0TlvFogTri *local_68;
  MthdEmuD3D56TlvColor *local_60;
  MthdEmuD3D56TlvX *local_58;
  MthdEmuD3D56TlvY *local_50;
  MthdEmuD3D56TlvZ *local_48;
  MthdEmuD3D56TlvW *local_40;
  MthdEmuD3D56TlvUv *local_38;
  MthdEmuD3D56TlvUv *local_30;
  iterator local_28;
  size_type local_20;
  EmuEmuD3D0 *local_18;
  EmuEmuD3D0 *this_local;
  
  local_18 = this;
  this_local = (EmuEmuD3D0 *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_112 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"nop",&local_111);
  MthdNop::SingleMthdTest
            ((MthdNop *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_110,-1,
             (this->super_Class).cls,0x100,1,4);
  local_112 = 0;
  local_e0 = this_00;
  this_01 = (MthdNotify *)operator_new(0x25950);
  local_13a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"notify",&local_139);
  MthdNotify::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_138,0,
             (this->super_Class).cls,0x104,1,4);
  local_13a = 0;
  local_d8 = this_01;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_162 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"pm_trigger",&local_161);
  MthdPmTrigger::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_160,-1,
             (this->super_Class).cls,0x140,1,4);
  local_162 = 0;
  local_d0 = this_02;
  this_03 = (MthdDmaNotify *)operator_new(0x25950);
  local_18a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"dma_notify",&local_189);
  MthdDmaNotify::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_188,1,
             (this->super_Class).cls,0x180,1,4);
  local_18a = 0;
  local_c8 = this_03;
  this_04 = (MthdDmaGrobj *)operator_new(0x25960);
  local_1b2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"dma_tex",&local_1b1);
  MthdDmaGrobj::MthdDmaGrobj
            (this_04,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1b0,2,
             (this->super_Class).cls,0x184,0,4);
  local_1b2 = 0;
  local_c0 = this_04;
  this_05 = (MthdCtxClip *)operator_new(0x25950);
  local_1da = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"ctx_clip",&local_1d9);
  MthdCtxClip::SingleMthdTest
            (this_05,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1d8,3,
             (this->super_Class).cls,0x188,1,4);
  local_1da = 0;
  local_b8 = this_05;
  pMVar2 = (MthdCtxSurf *)operator_new(0x25958);
  local_202 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"ctx_color",&local_201);
  MthdCtxSurf::MthdCtxSurf
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_200,4,
             (this->super_Class).cls,0x18c,2);
  local_202 = 0;
  local_b0 = pMVar2;
  pMVar2 = (MthdCtxSurf *)operator_new(0x25958);
  local_22a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"ctx_zeta",&local_229);
  MthdCtxSurf::MthdCtxSurf
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_228,5,
             (this->super_Class).cls,400,3);
  local_22a = 0;
  local_a8 = pMVar2;
  this_06 = (MthdMissing *)operator_new(0x25950);
  local_252 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"missing",&local_251);
  MthdMissing::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_250,-1,
             (this->super_Class).cls,0x200,4,4);
  local_252 = 0;
  local_a0 = this_06;
  this_07 = (MthdEmuD3D56TexOffset *)operator_new(0x25958);
  local_27a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"tex_offset",&local_279);
  MthdEmuD3D56TexOffset::MthdEmuD3D56TexOffset
            (this_07,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_278,6,
             (this->super_Class).cls,0x304,3);
  local_27a = 0;
  local_98 = this_07;
  this_08 = (MthdEmuEmuD3D0TexFormat *)operator_new(0x25950);
  local_2a2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"tex_format",&local_2a1);
  MthdEmuEmuD3D0TexFormat::SingleMthdTest
            (this_08,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2a0,7,
             (this->super_Class).cls,0x308,1,4);
  local_2a2 = 0;
  local_90 = this_08;
  this_09 = (MthdEmuEmuD3D0TexFilter *)operator_new(0x25950);
  local_2ca = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"tex_filter",&local_2c9);
  MthdEmuEmuD3D0TexFilter::SingleMthdTest
            (this_09,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2c8,8,
             (this->super_Class).cls,0x30c,1,4);
  local_2ca = 0;
  local_88 = this_09;
  this_10 = (MthdEmuD3D56FogColor *)operator_new(0x25950);
  local_2f2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"fog_color",&local_2f1);
  MthdEmuD3D56FogColor::SingleMthdTest
            (this_10,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2f0,9,
             (this->super_Class).cls,0x310,1,4);
  local_2f2 = 0;
  local_80 = this_10;
  this_11 = (MthdEmuEmuD3D0Config *)operator_new(0x25950);
  local_31a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"config",&local_319);
  MthdEmuEmuD3D0Config::SingleMthdTest
            (this_11,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_318,10,
             (this->super_Class).cls,0x314,1,4);
  local_31a = 0;
  local_78 = this_11;
  this_12 = (MthdEmuEmuD3D0Alpha *)operator_new(0x25950);
  local_342 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"alpha",&local_341);
  MthdEmuEmuD3D0Alpha::SingleMthdTest
            (this_12,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_340,0xb,
             (this->super_Class).cls,0x318,1,4);
  local_342 = 0;
  local_70 = this_12;
  this_13 = (MthdEmuEmuD3D0TlvFogTri *)operator_new(0x25950);
  local_36a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"tlv_fog_tri",&local_369);
  MthdEmuEmuD3D0TlvFogTri::SingleMthdTest
            (this_13,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_368,0xc,
             (this->super_Class).cls,0x1000,0x80,0x20);
  local_36a = 0;
  local_68 = this_13;
  this_14 = (MthdEmuD3D56TlvColor *)operator_new(0x25950);
  local_392 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"tlv_color",&local_391);
  MthdEmuD3D56TlvColor::SingleMthdTest
            (this_14,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_390,0xd,
             (this->super_Class).cls,0x1004,0x80,0x20);
  local_392 = 0;
  local_60 = this_14;
  this_15 = (MthdEmuD3D56TlvX *)operator_new(0x25950);
  local_3ba = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"tlv_x",&local_3b9);
  MthdEmuD3D56TlvX::SingleMthdTest
            (this_15,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_3b8,0xe,
             (this->super_Class).cls,0x1008,0x80,0x20);
  local_3ba = 0;
  local_58 = this_15;
  this_16 = (MthdEmuD3D56TlvY *)operator_new(0x25950);
  local_3e2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"tlv_y",&local_3e1);
  MthdEmuD3D56TlvY::SingleMthdTest
            (this_16,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_3e0,0xf,
             (this->super_Class).cls,0x100c,0x80,0x20);
  local_3e2 = 0;
  local_50 = this_16;
  this_17 = (MthdEmuD3D56TlvZ *)operator_new(0x25950);
  local_40a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"tlv_z",&local_409);
  MthdEmuD3D56TlvZ::SingleMthdTest
            (this_17,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_408,0x10,
             (this->super_Class).cls,0x1010,0x80,0x20);
  local_40a = 0;
  local_48 = this_17;
  this_18 = (MthdEmuD3D56TlvW *)operator_new(0x25950);
  local_432 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"tlv_rhw",&local_431);
  MthdEmuD3D56TlvW::SingleMthdTest
            (this_18,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_430,0x11,
             (this->super_Class).cls,0x1014,0x80,0x20);
  local_432 = 0;
  local_40 = this_18;
  pMVar3 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  local_45a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"tlv_u",&local_459);
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_458,0x12,
             (this->super_Class).cls,0x1018,0x80,0x20,0,0,false);
  local_45a = 0;
  local_38 = pMVar3;
  pMVar3 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  local_482 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"tlv_v",&local_481);
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_480,0x13,
             (this->super_Class).cls,0x101c,0x80,0x20,0,1,true);
  local_482 = 0;
  local_28 = &local_e0;
  local_20 = 0x17;
  local_30 = pMVar3;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_483);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_483);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_483);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> EmuEmuD3D0::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex", 2, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 3, cls, 0x188),
		new MthdCtxSurf(opt, rnd(), "ctx_color", 4, cls, 0x18c, 2),
		new MthdCtxSurf(opt, rnd(), "ctx_zeta", 5, cls, 0x190, 3),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200, 4),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_offset", 6, cls, 0x304, 3),
		new MthdEmuEmuD3D0TexFormat(opt, rnd(), "tex_format", 7, cls, 0x308),
		new MthdEmuEmuD3D0TexFilter(opt, rnd(), "tex_filter", 8, cls, 0x30c),
		new MthdEmuD3D56FogColor(opt, rnd(), "fog_color", 9, cls, 0x310),
		new MthdEmuEmuD3D0Config(opt, rnd(), "config", 10, cls, 0x314),
		new MthdEmuEmuD3D0Alpha(opt, rnd(), "alpha", 11, cls, 0x318),
		new MthdEmuEmuD3D0TlvFogTri(opt, rnd(), "tlv_fog_tri", 12, cls, 0x1000, 0x80, 0x20),
		new MthdEmuD3D56TlvColor(opt, rnd(), "tlv_color", 13, cls, 0x1004, 0x80, 0x20),
		new MthdEmuD3D56TlvX(opt, rnd(), "tlv_x", 14, cls, 0x1008, 0x80, 0x20),
		new MthdEmuD3D56TlvY(opt, rnd(), "tlv_y", 15, cls, 0x100c, 0x80, 0x20),
		new MthdEmuD3D56TlvZ(opt, rnd(), "tlv_z", 16, cls, 0x1010, 0x80, 0x20),
		new MthdEmuD3D56TlvW(opt, rnd(), "tlv_rhw", 17, cls, 0x1014, 0x80, 0x20),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u", 18, cls, 0x1018, 0x80, 0x20, 0, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v", 19, cls, 0x101c, 0x80, 0x20, 0, 1, true),
	};
}